

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void drop_kv_on_snap_iterator_test(void)

{
  FILE *pFVar1;
  fdb_status fVar2;
  char *pcVar3;
  fdb_kvs_handle *snap_kv;
  fdb_kvs_handle *kv;
  fdb_file_handle *f1;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *kv2;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&f1,"./mvcc_test1",&fconfig);
  fdb_kvs_open_default(f1,&kv2,&kvs_config);
  fdb_kvs_open(f1,&kv,"kv",&kvs_config);
  fVar2 = fdb_set_kv(kv,"a",1,(void *)0x0,0);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1556);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1556,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_set_kv(kv,"b",1,(void *)0x0,0);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1558);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1558,"void drop_kv_on_snap_iterator_test()");
  }
  fdb_commit(f1,'\x01');
  fVar2 = fdb_snapshot_open(kv,&snap_kv,2);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x155d);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x155d,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_iterator_init(snap_kv,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1561);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1561,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_kvs_close(snap_kv);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1564);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1564,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_kvs_close(kv);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1568);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1568,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_kvs_remove(f1,"kv");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x156c);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x156c,"void drop_kv_on_snap_iterator_test()");
  }
  fVar2 = fdb_iterator_get(iterator,&rdoc);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_doc_free(rdoc);
    fVar2 = fdb_iterator_close(iterator);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1573);
      drop_kv_on_snap_iterator_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1573,"void drop_kv_on_snap_iterator_test()");
    }
    fVar2 = fdb_kvs_close(snap_kv);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1575);
      drop_kv_on_snap_iterator_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1575,"void drop_kv_on_snap_iterator_test()");
    }
    fVar2 = fdb_kvs_close(kv2);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1577);
      drop_kv_on_snap_iterator_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1577,"void drop_kv_on_snap_iterator_test()");
    }
    fVar2 = fdb_close(f1);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar3 = "%s PASSED\n";
      if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar3,"drop kv other handle test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1579);
    drop_kv_on_snap_iterator_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1579,"void drop_kv_on_snap_iterator_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x156f);
  drop_kv_on_snap_iterator_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x156f,"void drop_kv_on_snap_iterator_test()");
}

Assistant:

void drop_kv_on_snap_iterator_test(){

    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_file_handle *f1;
    fdb_kvs_handle *kv, *kv2, *snap_kv;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&f1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(f1, &kv2, &kvs_config);
    fdb_kvs_open(f1, &kv, "kv", &kvs_config);

    // write 2 seqno's
    status = fdb_set_kv(kv, (void *) "a", 1, NULL, 0);
    TEST_STATUS(status);
    status = fdb_set_kv(kv, (void *) "b", 1, NULL, 0);
    TEST_STATUS(status);
    fdb_commit(f1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open snapshot
    status = fdb_snapshot_open(kv, &snap_kv, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open iterator on snapshot
    status = fdb_iterator_init(snap_kv, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    // close kvs
    status = fdb_kvs_close(kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // drop kvs
    status = fdb_kvs_remove(f1, "kv");
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(kv2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(f1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("drop kv other handle test");
}